

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,SPIRType *var_type,uint32_t mbr_idx,InterfaceBlockMeta *meta,
          string *mbr_name_qual,string *var_chain_qual,uint32_t *location,uint32_t *var_mbr_idx)

{
  undefined1 auVar1 [8];
  pointer puVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  size_type sVar12;
  size_type sVar13;
  mapped_type *pmVar14;
  SPIRType *pSVar15;
  SPIRConstant *pSVar16;
  undefined8 *puVar17;
  uint32_t uVar18;
  CompilerMSL *this_00;
  char (*ts_2) [2];
  bool local_2b6;
  bool local_2b5;
  BuiltIn builtin;
  char local_2a9;
  CompilerMSL *local_2a8;
  SPIRType *local_2a0;
  size_t local_298;
  SPIRFunction *local_290;
  _Any_data local_288;
  code *local_278;
  code *pcStack_270;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_268;
  string *local_260;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_258;
  uint local_24c;
  string qual_var_name;
  string var_chain;
  undefined1 local_208 [8];
  CompilerMSL *pCStack_200;
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [16];
  SPIRConstant *local_1e0;
  pointer local_1d8;
  undefined1 local_1d0 [352];
  string mbr_name;
  string local_50;
  
  local_2a8 = (CompilerMSL *)var;
  local_2a0 = ib_type;
  local_290 = Compiler::get<spirv_cross::SPIRFunction>
                        ((Compiler *)this,
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  builtin = BuiltInMax;
  bVar4 = Compiler::is_member_builtin((Compiler *)this,var_type,mbr_idx,&builtin);
  bVar5 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationFlat);
  local_2b5 = true;
  bVar6 = true;
  if (!bVar5) {
    bVar6 = Compiler::has_decoration
                      ((Compiler *)this,
                       (ID)*(uint32_t *)
                            &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                             super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                             .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                             _M_head_impl,DecorationFlat);
  }
  bVar5 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationNoPerspective);
  if (!bVar5) {
    local_2b5 = Compiler::has_decoration
                          ((Compiler *)this,
                           (ID)*(uint32_t *)
                                &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                                 super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                 .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                                 _M_head_impl,DecorationNoPerspective);
  }
  bVar5 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationCentroid);
  local_2b6 = true;
  bVar7 = true;
  if (!bVar5) {
    bVar7 = Compiler::has_decoration
                      ((Compiler *)this,
                       (ID)*(uint32_t *)
                            &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                             super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                             .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                             _M_head_impl,DecorationCentroid);
  }
  local_2a9 = bVar6;
  bVar5 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationSample);
  if (!bVar5) {
    local_2b6 = Compiler::has_decoration
                          ((Compiler *)this,
                           (ID)*(uint32_t *)
                                &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                                 super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                 .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                                 _M_head_impl,DecorationSample);
  }
  local_258 = &local_2a0->member_types;
  local_298 = (local_2a0->member_types).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
  uVar9 = ensure_correct_builtin_type
                    (this,(var_type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                          [mbr_idx].id,builtin);
  (var_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
  [mbr_idx].id = uVar9;
  local_24c = (uint)local_2b5;
  if (storage == StorageClassInput) {
    local_208._0_4_ =
         *(undefined4 *)
          &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    sVar12 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->pull_model_inputs)._M_h,(key_type *)local_208);
    if (sVar12 == 0) goto LAB_001d8cd4;
    uVar10 = build_msl_interpolant_type(this,uVar9,local_2b5);
    local_208._0_4_ = uVar10;
  }
  else {
LAB_001d8cd4:
    local_208._0_4_ = uVar9;
  }
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
            (local_258,(TypedID<(spirv_cross::Types)1> *)local_208);
  ts_2 = (char (*) [2])(ulong)mbr_idx;
  append_member_name(&local_50,this,mbr_name_qual,var_type,mbr_idx);
  this_00 = (CompilerMSL *)0x294dd6;
  ::std::__cxx11::string::string((string *)(local_1d0 + 0x140),"m",(allocator *)local_208);
  ensure_valid_name(&mbr_name,this_00,&local_50,(string *)(local_1d0 + 0x140));
  ::std::__cxx11::string::~string((string *)(local_1d0 + 0x140));
  ::std::__cxx11::string::~string((string *)&local_50);
  local_260 = &mbr_name;
  Compiler::set_member_name
            ((Compiler *)this,(TypeID)(local_2a0->super_IVariant).self.id,(uint32_t)local_298,
             local_260);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   ib_var_ref,".");
  ::std::operator+(&qual_var_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   &mbr_name);
  ::std::__cxx11::string::~string((string *)local_208);
  if (storage == StorageClassInput) {
    local_208._0_4_ =
         *(undefined4 *)
          &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    sVar12 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->pull_model_inputs)._M_h,(key_type *)local_208);
    if (sVar12 != 0) {
      if (local_2b6 == true && bVar7 == false) {
        CompilerGLSL::to_expression_abi_cxx11_
                  (&var_chain,&this->super_CompilerGLSL,this->builtin_sample_id_id,true);
        join<char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                  ((string *)local_208,(spirv_cross *)".interpolate_at_sample(",
                   (char (*) [24])&var_chain,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,
                   ts_2);
        ::std::__cxx11::string::append((string *)&qual_var_name);
        ::std::__cxx11::string::~string((string *)local_208);
        ::std::__cxx11::string::~string((string *)&var_chain);
      }
      else {
        ::std::__cxx11::string::append((char *)&qual_var_name);
      }
    }
  }
  bVar5 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationLocation);
  bVar6 = Compiler::has_decoration
                    ((Compiler *)this,
                     (ID)*(uint32_t *)
                          &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                           _M_head_impl,DecorationLocation);
  if (bVar5) {
    uVar10 = Compiler::get_member_decoration
                       ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                        DecorationLocation);
  }
  else if (bVar6) {
    uVar10 = CompilerGLSL::get_accumulated_member_location
                       (&this->super_CompilerGLSL,(SPIRVariable *)local_2a8,mbr_idx,
                        meta->strip_array);
  }
  else {
    uVar10 = 0xffffffff;
    if (bVar4) {
      bVar8 = Compiler::is_tessellation_shader((Compiler *)this);
      if (bVar8 && storage == StorageClassInput) {
        local_268 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->inputs_by_builtin;
        local_208._0_4_ = builtin;
        sVar13 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)local_268,(key_type *)local_208);
        if (sVar13 != 0) {
          local_208._0_4_ = builtin;
          pmVar14 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_268,(key_type *)local_208);
LAB_001d91fa:
          uVar10 = pmVar14->location;
        }
      }
      else if ((storage == StorageClassOutput) && (this->capture_output_to_buffer != false)) {
        local_268 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->outputs_by_builtin;
        local_208._0_4_ = builtin;
        sVar13 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)local_268,(key_type *)local_208);
        if (sVar13 != 0) {
          local_208._0_4_ = builtin;
          pmVar14 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_268,(key_type *)local_208);
          goto LAB_001d91fa;
        }
      }
    }
  }
  uVar18 = *location;
  if ((uVar18 == 0xffffffff) && (uVar10 != 0xffffffff)) {
    *location = uVar10;
    uVar18 = uVar10;
  }
  if ((bVar6 || bVar5) && storage == StorageClassInput) {
    uVar11 = 0;
    if (bVar5) {
      uVar11 = Compiler::get_member_decoration
                         ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                          DecorationComponent);
      uVar18 = *location;
    }
    uVar11 = ensure_correct_input_type(this,uVar9,uVar18,uVar11,0,meta->strip_array);
    if (uVar11 == uVar9) {
      uVar18 = 0xffffffff;
    }
    else {
      pSVar15 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar9);
      uVar18 = pSVar15->vecsize;
    }
    local_208._0_4_ =
         *(undefined4 *)
          &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    sVar12 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->pull_model_inputs)._M_h,(key_type *)local_208);
    uVar9 = uVar11;
    if (sVar12 != 0) {
      uVar9 = build_msl_interpolant_type(this,uVar11,SUB41(local_24c,0));
    }
    (local_258->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr
    [local_298 & 0xffffffff].id = uVar9;
    uVar9 = uVar11;
  }
  else {
    uVar18 = 0xffffffff;
  }
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   var_chain_qual,".");
  CompilerGLSL::to_member_name_abi_cxx11_
            ((string *)&local_288,&this->super_CompilerGLSL,var_type,mbr_idx);
  ::std::operator+(&var_chain,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_288);
  ::std::__cxx11::string::~string((string *)local_288._M_pod_data);
  ::std::__cxx11::string::~string((string *)local_208);
  if ((bVar4) && ((meta->strip_array & 1U) == 0)) {
    Compiler::set_member_qualified_name
              ((Compiler *)this,(var_type->super_IVariant).self.id,mbr_idx,&qual_var_name);
    bVar5 = false;
LAB_001d933d:
    if (uVar10 != 0xffffffff) {
      uVar10 = *location;
LAB_001d9361:
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(local_2a0->super_IVariant).self.id,(uint32_t)local_298,
                 DecorationLocation,uVar10);
      uVar10 = *location;
      pSVar15 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar9);
      mark_location_as_used_by_shader(this,uVar10,pSVar15,storage,false);
      pSVar15 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar9);
      uVar9 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar15);
      *location = *location + uVar9;
    }
  }
  else {
    if (((meta->strip_array & 1U) == 0) && (meta->allow_local_declaration == true)) {
      if (storage != StorageClassOutput) {
        if (storage == StorageClassInput) {
          local_208._0_4_ = uVar18;
          pCStack_200 = this;
          ::std::__cxx11::string::string((string *)local_1f8,(string *)&var_chain);
          ::std::__cxx11::string::string((string *)&local_1d8,(string *)&qual_var_name);
          local_278 = (code *)0x0;
          pcStack_270 = (code *)0x0;
          local_288._M_unused._M_object = (void *)0x0;
          local_288._8_8_ = 0;
          local_288._M_unused._M_object = operator_new(0x50);
          uVar3 = local_1d0._0_8_;
          *(undefined1 (*) [8])local_288._M_unused._0_8_ = local_208;
          *(CompilerMSL **)((long)local_288._M_unused._0_8_ + 8) = pCStack_200;
          *(code **)((long)local_288._M_unused._0_8_ + 0x10) =
               (code *)((long)local_288._M_unused._0_8_ + 0x20);
          if (local_1f8 == (undefined1  [8])(local_1f0 + 8)) {
            *(ulong *)((long)local_288._M_unused._0_8_ + 0x20) =
                 CONCAT71(local_1f0._9_7_,local_1f0[8]);
            *(SPIRConstant **)((long)local_288._M_unused._0_8_ + 0x28) = local_1e0;
          }
          else {
            *(undefined1 (*) [8])((long)local_288._M_unused._0_8_ + 0x10) = local_1f8;
            *(ulong *)((long)local_288._M_unused._0_8_ + 0x20) =
                 CONCAT71(local_1f0._9_7_,local_1f0[8]);
          }
          *(undefined8 *)((long)local_288._M_unused._0_8_ + 0x18) = local_1f0._0_8_;
          local_1f0._0_8_ = 0;
          local_1f0[8] = 0;
          *(code **)((long)local_288._M_unused._0_8_ + 0x30) =
               (code *)((long)local_288._M_unused._0_8_ + 0x40);
          if (local_1d8 == (pointer)(local_1d0 + 8)) {
            *(ulong *)((long)local_288._M_unused._0_8_ + 0x40) =
                 CONCAT71(local_1d0._9_7_,local_1d0[8]);
            *(undefined8 *)((long)local_288._M_unused._0_8_ + 0x48) = local_1d0._16_8_;
          }
          else {
            *(pointer *)((long)local_288._M_unused._0_8_ + 0x30) = local_1d8;
            *(ulong *)((long)local_288._M_unused._0_8_ + 0x40) =
                 CONCAT71(local_1d0._9_7_,local_1d0[8]);
          }
          local_1d0._0_8_ = (_func_int **)0x0;
          *(undefined8 *)((long)local_288._M_unused._0_8_ + 0x38) = uVar3;
          local_1d0[8] = 0;
          pcStack_270 = ::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp:3445:40)>
                        ::_M_invoke;
          local_278 = ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp:3445:40)>
                      ::_M_manager;
          local_1f8 = (undefined1  [8])(local_1f0 + 8);
          local_1d8 = (pointer)(local_1d0 + 8);
          SmallVector<std::function<void_()>,_0UL>::push_back
                    (&local_290->fixup_hooks_in,(function<void_()> *)&local_288);
          ::std::_Function_base::~_Function_base((_Function_base *)&local_288);
          add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)
          ::$_0::~__0((__0 *)local_208);
        }
        goto LAB_001d9333;
      }
      local_208 = (undefined1  [8])this;
      ::std::__cxx11::string::string((string *)&pCStack_200,(string *)&qual_var_name);
      ::std::__cxx11::string::string((string *)&local_1e0,(string *)&var_chain);
      local_278 = (code *)0x0;
      pcStack_270 = (code *)0x0;
      local_288._M_unused._M_object = (void *)0x0;
      local_288._8_8_ = 0;
      local_288._M_unused._M_object = operator_new(0x48);
      puVar2 = local_1d8;
      *(undefined1 (*) [8])local_288._M_unused._0_8_ = local_208;
      *(code **)((long)local_288._M_unused._0_8_ + 8) =
           (code *)((long)local_288._M_unused._0_8_ + 0x18);
      if (pCStack_200 == (CompilerMSL *)local_1f0) {
        *(undefined8 *)((long)local_288._M_unused._0_8_ + 0x18) = local_1f0._0_8_;
        *(ulong *)((long)local_288._M_unused._0_8_ + 0x20) = CONCAT71(local_1f0._9_7_,local_1f0[8]);
      }
      else {
        *(CompilerMSL **)((long)local_288._M_unused._0_8_ + 8) = pCStack_200;
        *(undefined8 *)((long)local_288._M_unused._0_8_ + 0x18) = local_1f0._0_8_;
      }
      *(undefined1 (*) [8])((long)local_288._M_unused._0_8_ + 0x10) = local_1f8;
      local_1f8 = (undefined1  [8])0x0;
      local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
      *(code **)((long)local_288._M_unused._0_8_ + 0x28) =
           (code *)((long)local_288._M_unused._0_8_ + 0x38);
      if (local_1e0 == (SPIRConstant *)local_1d0) {
        *(undefined8 *)((long)local_288._M_unused._0_8_ + 0x38) = local_1d0._0_8_;
        *(ulong *)((long)local_288._M_unused._0_8_ + 0x40) = CONCAT71(local_1d0._9_7_,local_1d0[8]);
      }
      else {
        *(SPIRConstant **)((long)local_288._M_unused._0_8_ + 0x28) = local_1e0;
        *(undefined8 *)((long)local_288._M_unused._0_8_ + 0x38) = local_1d0._0_8_;
      }
      local_1d8 = (pointer)0x0;
      *(pointer *)((long)local_288._M_unused._0_8_ + 0x30) = puVar2;
      local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
      pcStack_270 = ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp:3456:41)>
                    ::_M_invoke;
      local_278 = ::std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp:3456:41)>
                  ::_M_manager;
      pCStack_200 = (CompilerMSL *)local_1f0;
      local_1e0 = (SPIRConstant *)local_1d0;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&local_290->fixup_hooks_out,(function<void_()> *)&local_288);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_288);
      add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)
      ::$_1::~__1((__1 *)local_208);
      bVar5 = true;
    }
    else {
LAB_001d9333:
      bVar5 = false;
    }
    if (bVar4) goto LAB_001d933d;
    uVar10 = *location;
    if (uVar10 != 0xffffffff) goto LAB_001d9361;
  }
  bVar6 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationComponent);
  if (bVar6) {
    uVar9 = Compiler::get_member_decoration
                      ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                       DecorationComponent);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(local_2a0->super_IVariant).self.id,(uint32_t)local_298,
               DecorationComponent,uVar9);
  }
  if (((bVar4) &&
      (Compiler::set_member_decoration
                 ((Compiler *)this,(TypeID)(local_2a0->super_IVariant).self.id,(uint32_t)local_298,
                  DecorationBuiltIn,builtin), storage == StorageClassOutput)) &&
     (builtin == BuiltInPosition)) {
    ::std::__cxx11::string::_M_assign((string *)&this->qual_pos_var_name);
  }
  if (((!bVar5 && *(int *)&(local_2a8->super_CompilerGLSL).super_Compiler.ir.spirv.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start == 3) &&
      (uVar9 = *(uint32_t *)
                ((long)&(local_2a8->super_CompilerGLSL).super_Compiler.ir.spirv.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data + 8), uVar9 != 0)) &&
     (pSVar16 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar9),
     pSVar16 != (SPIRConstant *)0x0)) {
    local_290 = (SPIRFunction *)&local_290->fixup_hooks_in;
    if (meta->strip_array == true) {
      local_208 = (undefined1  [8])local_2a8;
      local_1f8._0_4_ = mbr_idx;
      pCStack_200 = this;
      SPIRType::SPIRType((SPIRType *)local_1f0,local_2a0);
      local_278 = (code *)0x0;
      pcStack_270 = (code *)0x0;
      local_288._M_unused._M_object = (void *)0x0;
      local_288._8_8_ = 0;
      puVar17 = (undefined8 *)operator_new(0x178);
      *(undefined4 *)(puVar17 + 2) = local_1f8._0_4_;
      *puVar17 = local_208;
      puVar17[1] = pCStack_200;
      SPIRType::SPIRType((SPIRType *)(puVar17 + 3),(SPIRType *)local_1f0);
      pcStack_270 = ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp:3494:40)>
                    ::_M_invoke;
      local_278 = ::std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp:3494:40)>
                  ::_M_manager;
      local_288._M_unused._M_object = puVar17;
      SmallVector<std::function<void_()>,_0UL>::push_back
                ((SmallVector<std::function<void_()>,_0UL> *)local_290,
                 (function<void_()> *)&local_288);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_288);
      SPIRType::~SPIRType((SPIRType *)local_1f0);
    }
    else {
      local_208 = (undefined1  [8])this;
      ::std::__cxx11::string::string((string *)&pCStack_200,(string *)&qual_var_name);
      local_1d8 = (pointer)CONCAT44(local_1d8._4_4_,mbr_idx);
      local_288._M_unused._M_object = (void *)0x0;
      local_288._8_8_ = 0;
      local_278 = (code *)0x0;
      pcStack_270 = (code *)0x0;
      local_1e0 = pSVar16;
      local_288._M_unused._M_object = operator_new(0x38);
      auVar1 = local_1f8;
      *(undefined1 (*) [8])local_288._M_unused._0_8_ = local_208;
      *(code **)((long)local_288._M_unused._0_8_ + 8) =
           (code *)((long)local_288._M_unused._0_8_ + 0x18);
      if (pCStack_200 == (CompilerMSL *)local_1f0) {
        *(undefined8 *)((long)local_288._M_unused._0_8_ + 0x18) = local_1f0._0_8_;
        *(ulong *)((long)local_288._M_unused._0_8_ + 0x20) = CONCAT71(local_1f0._9_7_,local_1f0[8]);
      }
      else {
        *(CompilerMSL **)((long)local_288._M_unused._0_8_ + 8) = pCStack_200;
        *(undefined8 *)((long)local_288._M_unused._0_8_ + 0x18) = local_1f0._0_8_;
      }
      local_1f8 = (undefined1  [8])0x0;
      *(undefined1 (*) [8])((long)local_288._M_unused._0_8_ + 0x10) = auVar1;
      local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
      *(uint32_t *)((long)local_288._M_unused._0_8_ + 0x30) = (uint32_t)local_1d8;
      *(SPIRConstant **)((long)local_288._M_unused._0_8_ + 0x28) = local_1e0;
      pcStack_270 = ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp:3508:40)>
                    ::_M_invoke;
      local_278 = ::std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp:3508:40)>
                  ::_M_manager;
      pCStack_200 = (CompilerMSL *)local_1f0;
      SmallVector<std::function<void_()>,_0UL>::push_back
                ((SmallVector<std::function<void_()>,_0UL> *)local_290,
                 (function<void_()> *)&local_288);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_288);
      ::std::__cxx11::string::~string((string *)&pCStack_200);
    }
  }
  if (storage == StorageClassInput) {
    local_208._0_4_ =
         *(undefined4 *)
          &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    sVar12 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->pull_model_inputs)._M_h,(key_type *)local_208);
    if (sVar12 != 0) goto LAB_001d9702;
  }
  if (local_2a9 != '\0') {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(local_2a0->super_IVariant).self.id,(uint32_t)local_298,
               DecorationFlat,0);
  }
  if (local_2b5 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(local_2a0->super_IVariant).self.id,(uint32_t)local_298,
               DecorationNoPerspective,0);
  }
  if (bVar7 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(local_2a0->super_IVariant).self.id,(uint32_t)local_298,
               DecorationCentroid,0);
  }
  if (local_2b6 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(local_2a0->super_IVariant).self.id,(uint32_t)local_298,
               DecorationSample,0);
  }
LAB_001d9702:
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(local_2a0->super_IVariant).self.id,(uint32_t)local_298,
             SPIRVCrossDecorationInterfaceOrigID,
             *(uint32_t *)
              &(local_2a8->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
               super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl);
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(local_2a0->super_IVariant).self.id,(uint32_t)local_298,
             SPIRVCrossDecorationInterfaceMemberIndex,*var_mbr_idx);
  ::std::__cxx11::string::~string((string *)&var_chain);
  ::std::__cxx11::string::~string((string *)&qual_var_name);
  ::std::__cxx11::string::~string((string *)&mbr_name);
  return;
}

Assistant:

void CompilerMSL::add_plain_member_variable_to_interface_block(StorageClass storage,
                                                               const string &ib_var_ref, SPIRType &ib_type,
                                                               SPIRVariable &var, SPIRType &var_type,
                                                               uint32_t mbr_idx, InterfaceBlockMeta &meta,
                                                               const string &mbr_name_qual,
                                                               const string &var_chain_qual,
                                                               uint32_t &location, uint32_t &var_mbr_idx)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
	bool is_flat =
	    has_member_decoration(var_type.self, mbr_idx, DecorationFlat) || has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_member_decoration(var_type.self, mbr_idx, DecorationNoPerspective) ||
	                        has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_member_decoration(var_type.self, mbr_idx, DecorationCentroid) ||
	                   has_decoration(var.self, DecorationCentroid);
	bool is_sample =
	    has_member_decoration(var_type.self, mbr_idx, DecorationSample) || has_decoration(var.self, DecorationSample);

	// Add a reference to the member to the interface struct.
	uint32_t mbr_type_id = var_type.member_types[mbr_idx];
	uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());
	mbr_type_id = ensure_correct_builtin_type(mbr_type_id, builtin);
	var_type.member_types[mbr_idx] = mbr_type_id;
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
		ib_type.member_types.push_back(build_msl_interpolant_type(mbr_type_id, is_noperspective));
	else
		ib_type.member_types.push_back(mbr_type_id);

	// Give the member a name
	string mbr_name = ensure_valid_name(append_member_name(mbr_name_qual, var_type, mbr_idx), "m");
	set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

	// Update the original variable reference to include the structure reference
	string qual_var_name = ib_var_ref + "." + mbr_name;
	// If using pull-model interpolation, need to add a call to the correct interpolation method.
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
	{
		if (is_centroid)
			qual_var_name += ".interpolate_at_centroid()";
		else if (is_sample)
			qual_var_name += join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
		else
			qual_var_name += ".interpolate_at_center()";
	}

	// The SPIRV location of interface variable, used to obtain the initial
	// MSL location (the location variable) and interface matching
	uint32_t ir_location = UINT32_MAX;
	bool has_member_loc_decor = has_member_decoration(var_type.self, mbr_idx, DecorationLocation);
	bool has_var_loc_decor = has_decoration(var.self, DecorationLocation);
	uint32_t orig_vecsize = UINT32_MAX;

	if (has_member_loc_decor)
		ir_location = get_member_decoration(var_type.self, mbr_idx, DecorationLocation);
	else if (has_var_loc_decor)
		ir_location = get_accumulated_member_location(var, mbr_idx, meta.strip_array);
	else if (is_builtin)
	{
		if (is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
			ir_location = inputs_by_builtin[builtin].location;
		else if (capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
			ir_location = outputs_by_builtin[builtin].location;
	}

	// Once we determine the location of the first member within nested structures,
	// from a var of the topmost structure, the remaining flattened members of
	// the nested structures will have consecutive location values. At this point,
	// we've recursively tunnelled into structs, arrays, and matrices, and are
	// down to a single location for each member now.
	if (location == UINT32_MAX && ir_location != UINT32_MAX)
		location = ir_location;

	if (storage == StorageClassInput && (has_member_loc_decor || has_var_loc_decor))
	{
		uint32_t component = 0;
		uint32_t orig_mbr_type_id = mbr_type_id;

		if (has_member_loc_decor)
			component = get_member_decoration(var_type.self, mbr_idx, DecorationComponent);

		mbr_type_id = ensure_correct_input_type(mbr_type_id, location, component, 0, meta.strip_array);

		// For members of the composite interface block, we only change the interface block type
		// when interface matching happens. In the meantime, we store the original vector size
		// and insert a swizzle when loading from metal interface block (see fixup below)
		if (mbr_type_id != orig_mbr_type_id)
			orig_vecsize = get<SPIRType>(orig_mbr_type_id).vecsize;

		if (storage == StorageClassInput && pull_model_inputs.count(var.self))
			ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(mbr_type_id, is_noperspective);
		else
			ib_type.member_types[ib_mbr_idx] = mbr_type_id;
	}

	bool flatten_stage_out = false;
	string var_chain = var_chain_qual + "." + to_member_name(var_type, mbr_idx);
	if (is_builtin && !meta.strip_array)
	{
		// For the builtin gl_PerVertex, we cannot treat it as a block anyways,
		// so redirect to qualified name.
		set_member_qualified_name(var_type.self, mbr_idx, qual_var_name);
	}
	else if (!meta.strip_array && meta.allow_local_declaration)
	{
		// Unflatten or flatten from [[stage_in]] or [[stage_out]] as appropriate.
		switch (storage)
		{
		case StorageClassInput:
			entry_func.fixup_hooks_in.push_back([=]() {
				string swizzle;
				// Insert swizzle for widened interface block vector from interface matching
				if (orig_vecsize != UINT32_MAX)
					swizzle = vector_swizzle(orig_vecsize, 0);
				statement(var_chain, " = ", qual_var_name, swizzle, ";");
			});
			break;

		case StorageClassOutput:
			flatten_stage_out = true;
			entry_func.fixup_hooks_out.push_back([=]() {
				statement(qual_var_name, " = ", var_chain, ";");
			});
			break;

		default:
			break;
		}
	}

	if ((!is_builtin && location != UINT32_MAX) || (is_builtin && ir_location != UINT32_MAX))
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}

	// Copy the component location, if present.
	if (has_member_decoration(var_type.self, mbr_idx, DecorationComponent))
	{
		uint32_t comp = get_member_decoration(var_type.self, mbr_idx, DecorationComponent);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, comp);
	}

	// Mark the member as builtin if needed
	if (is_builtin)
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
		if (builtin == BuiltInPosition && storage == StorageClassOutput)
			qual_pos_var_name = qual_var_name;
	}

	const SPIRConstant *c = nullptr;
	if (!flatten_stage_out && var.storage == StorageClassOutput &&
	    var.initializer != ID(0) && (c = maybe_get<SPIRConstant>(var.initializer)))
	{
		if (meta.strip_array)
		{
			entry_func.fixup_hooks_in.push_back([=, &var]() {
				auto &type = this->get<SPIRType>(var.basetype);
				uint32_t index = get_extended_member_decoration(var.self, mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex);

				auto invocation = to_tesc_invocation_id();
				auto constant_chain = join(to_expression(var.initializer), "[", invocation, "]");
				statement(to_expression(stage_out_ptr_var_id), "[",
				          invocation, "].",
				          to_member_name(ib_type, index), " = ",
				          constant_chain, ".", to_member_name(type, mbr_idx), ";");
			});
		}
		else
		{
			entry_func.fixup_hooks_in.push_back([=]() {
				statement(qual_var_name, " = ", constant_expression(
						this->get<SPIRConstant>(c->subconstants[mbr_idx])), ";");
			});
		}
	}

	if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
	{
		// Copy interpolation decorations if needed
		if (is_flat)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
		if (is_noperspective)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
		if (is_centroid)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
		if (is_sample)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
	}

	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);
	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex, var_mbr_idx);
}